

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::LoadStoreMachine::GenLoadShader<tcu::Vector<int,4>>
          (string *__return_storage_ptr__,LoadStoreMachine *this,int stage,GLenum internalformat,
          Vector<int,_4> *expected_value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ostream *poVar2;
  string *psVar3;
  undefined4 in_register_0000000c;
  GLenum e;
  GLenum e_00;
  GLenum e_01;
  GLenum e_02;
  GLenum e_03;
  GLenum e_04;
  GLenum e_05;
  long lVar4;
  uint uVar5;
  char *pcVar6;
  ostringstream os;
  string local_3b8;
  string *local_398;
  Vector<int,_4> *local_390;
  string local_388;
  string local_368;
  char *local_348;
  undefined8 local_340;
  undefined2 local_338;
  undefined6 uStack_336;
  string local_328;
  char *local_308;
  undefined8 local_300;
  undefined2 local_2f8;
  undefined6 uStack_2f6;
  string local_2e8;
  char *local_2c8;
  undefined8 local_2c0;
  undefined2 local_2b8;
  undefined6 uStack_2b6;
  string local_2a8;
  char *local_288;
  undefined8 local_280;
  undefined2 local_278;
  undefined6 uStack_276;
  string local_268;
  char *local_248;
  undefined8 local_240;
  undefined2 local_238;
  undefined6 uStack_236;
  char *local_228;
  undefined8 local_220;
  undefined2 local_218;
  undefined6 uStack_216;
  char *local_208;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined6 uStack_1f6;
  char *local_1e8;
  undefined8 local_1e0;
  undefined2 local_1d8;
  undefined6 uStack_1d6;
  char *local_1c8;
  undefined8 local_1c0;
  undefined2 local_1b8;
  undefined6 uStack_1b6;
  undefined1 local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"#version 420 core",0x11);
  uVar5 = (uint)this;
  if (uVar5 == 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\n#extension GL_ARB_compute_shader : require",0x2b);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\nlayout(",8);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_(&local_3b8,(void *)(ulong)(uint)stage,e);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_3b8._M_dataplus._M_p,local_3b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") readonly uniform ",0x13);
  local_248 = (char *)&local_238;
  local_238 = 0x69;
  local_240 = 1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_248,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"image2D g_image_2d;\nlayout(",0x1b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_268,(void *)(ulong)(uint)stage,e_00);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_268._M_dataplus._M_p,local_268._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") readonly uniform ",0x13);
  local_288 = (char *)&local_278;
  local_278 = 0x69;
  local_280 = 1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"image3D g_image_3d;\nlayout(",0x1b);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2a8,(void *)(ulong)(uint)stage,e_01);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_2a8._M_dataplus._M_p,local_2a8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") readonly uniform ",0x13);
  local_2c8 = (char *)&local_2b8;
  local_2b8 = 0x69;
  local_2c0 = 1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_2c8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"image2DRect g_image_2drect;\nlayout(",0x23);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_2e8,(void *)(ulong)(uint)stage,e_02);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_2e8._M_dataplus._M_p,local_2e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") readonly uniform ",0x13);
  local_308 = (char *)&local_2f8;
  local_2f8 = 0x69;
  local_300 = 1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_308,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"imageCube g_image_cube;\nlayout(",0x1f)
  ;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_328,(void *)(ulong)(uint)stage,e_03);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_328._M_dataplus._M_p,local_328._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") readonly uniform ",0x13);
  local_348 = (char *)&local_338;
  local_338 = 0x69;
  local_340 = 1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_348,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"image1DArray g_image_1darray;\nlayout(",0x25);
  local_390 = (Vector<int,_4> *)CONCAT44(in_register_0000000c,internalformat);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_368,(void *)(ulong)(uint)stage,e_04);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_368._M_dataplus._M_p,local_368._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") readonly uniform ",0x13);
  local_1b8 = 0x69;
  local_1c0 = 1;
  local_1c8 = (char *)&local_1b8;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1b8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"image2DArray g_image_2darray;\nlayout(",0x25);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_388,(void *)(ulong)(uint)stage,e_05);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_388._M_dataplus._M_p,local_388._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") readonly uniform ",0x13);
  local_1d8 = 0x69;
  local_1e0 = 1;
  local_398 = __return_storage_ptr__;
  local_1e8 = (char *)&local_1d8;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "imageCubeArray g_image_cube_array;\nlayout(rgba32f) writeonly uniform image2D g_image_result;\nuniform "
             ,0x65);
  local_1f8 = 0x69;
  local_200 = 1;
  local_208 = (char *)&local_1f8;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1f8,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vec4 g_value = ",0xf);
  local_218 = 0x69;
  local_220 = 1;
  local_228 = (char *)&local_218;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_218,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vec4",4);
  poVar2 = tcu::operator<<(poVar2,local_390);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,";\nuniform int g_index[6] = int[](0, 1, 2, 3, 4, 5);",0x33);
  if (local_228 != (char *)&local_218) {
    operator_delete(local_228,CONCAT62(uStack_216,local_218) + 1);
  }
  if (local_208 != (char *)&local_1f8) {
    operator_delete(local_208,CONCAT62(uStack_1f6,local_1f8) + 1);
  }
  if (local_1e8 != (char *)&local_1d8) {
    operator_delete(local_1e8,CONCAT62(uStack_1d6,local_1d8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p != &local_388.field_2) {
    operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != (char *)&local_1b8) {
    operator_delete(local_1c8,CONCAT62(uStack_1b6,local_1b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != (char *)&local_338) {
    operator_delete(local_348,CONCAT62(uStack_336,local_338) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if (local_308 != (char *)&local_2f8) {
    operator_delete(local_308,CONCAT62(uStack_2f6,local_2f8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if (local_2c8 != (char *)&local_2b8) {
    operator_delete(local_2c8,CONCAT62(uStack_2b6,local_2b8) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if (local_288 != (char *)&local_278) {
    operator_delete(local_288,CONCAT62(uStack_276,local_278) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != (char *)&local_238) {
    operator_delete(local_248,CONCAT62(uStack_236,local_238) + 1);
  }
  paVar1 = &local_3b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT62(local_3b8.field_2._M_allocated_capacity._2_6_,
                             local_3b8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (uVar5 < 4) {
    pcVar6 = (&PTR_anon_var_dwarf_4a5ad1_020dab90)[(ulong)this & 0xffffffff];
    lVar4 = *(long *)(&DAT_01a77a80 + ((ulong)this & 0xffffffff) * 8);
  }
  else {
    if (uVar5 != 4) goto LAB_009bd6e8;
    lVar4 = 0x67;
    pcVar6 = 
    "\nlayout(local_size_x = 1) in;\nvoid main() {\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);"
    ;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar4);
LAB_009bd6e8:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"\n  vec4 r = vec4(0, 1, 0, 1);\n  ",0x20);
  local_3b8.field_2._M_allocated_capacity._0_2_ = 0x69;
  local_3b8._M_string_length = 1;
  local_3b8._M_dataplus._M_p = (pointer)paVar1;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,paVar1->_M_local_buf,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "vec4 v;\n  v = imageLoad(g_image_2d, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_2drect, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_1darray, coord);\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  v = imageLoad(g_image_cube_array, ivec3(coord, g_index[0]));\n  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);\n  imageStore(g_image_result, coord, r);\n}"
             ,0x2ef);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT62(local_3b8.field_2._M_allocated_capacity._2_6_,
                             local_3b8.field_2._M_allocated_capacity._0_2_) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar3 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

std::string GenLoadShader(int stage, GLenum internalformat, const T& expected_value)
	{
		std::ostringstream os;
		os << "#version 420 core";
		if (stage == 4)
		{ // CS
			os << NL "#extension GL_ARB_compute_shader : require";
		}
		os << NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "image2D g_image_2d;" NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform "
		   << TypePrefix<T>() << "image3D g_image_3d;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") readonly uniform " << TypePrefix<T>() << "image2DRect g_image_2drect;" NL "layout("
		   << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "imageCube g_image_cube;" NL "layout(" << FormatEnumToString(internalformat) << ") readonly uniform "
		   << TypePrefix<T>() << "image1DArray g_image_1darray;" NL "layout(" << FormatEnumToString(internalformat)
		   << ") readonly uniform " << TypePrefix<T>() << "image2DArray g_image_2darray;" NL "layout("
		   << FormatEnumToString(internalformat) << ") readonly uniform " << TypePrefix<T>()
		   << "imageCubeArray g_image_cube_array;" NL "layout(rgba32f) writeonly uniform image2D g_image_result;" NL
			  "uniform "
		   << TypePrefix<T>() << "vec4 g_value = " << TypePrefix<T>() << "vec4" << expected_value
		   << ";" NL "uniform int g_index[6] = int[](0, 1, 2, 3, 4, 5);";
		if (stage == 0)
		{ // VS
			os << NL "void main() {" NL "  ivec2 coord = ivec2(gl_VertexID, g_index[0]);";
		}
		else if (stage == 1)
		{ // TCS
			os << NL "layout(vertices = 1) out;" NL "void main() {" NL "  gl_TessLevelInner[0] = 1;" NL
					 "  gl_TessLevelInner[1] = 1;" NL "  gl_TessLevelOuter[0] = 1;" NL "  gl_TessLevelOuter[1] = 1;" NL
					 "  gl_TessLevelOuter[2] = 1;" NL "  gl_TessLevelOuter[3] = 1;" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);";
		}
		else if (stage == 2)
		{ // TES
			os << NL "layout(quads, point_mode) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveID, g_index[0]);";
		}
		else if (stage == 3)
		{ // GS
			os << NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_PrimitiveIDIn, g_index[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = 1) in;" NL "void main() {" NL
					 "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_index[0]);";
		}
		os << NL "  vec4 r = vec4(0, 1, 0, 1);" NL "  " << TypePrefix<T>()
		   << "vec4 v;" NL "  v = imageLoad(g_image_2d, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_3d, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  v = imageLoad(g_image_2drect, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_cube, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  v = imageLoad(g_image_1darray, coord);" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_2darray, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL
			  "  v = imageLoad(g_image_cube_array, ivec3(coord, g_index[0]));" NL
			  "  if (v != g_value) r = vec4(1.0, 0.0, 0.0, 1.0);" NL "  imageStore(g_image_result, coord, r);" NL "}";
		return os.str();
	}